

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall
kj::ArrayOutputStream::write(ArrayOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_2;
  byte *pbVar1;
  undefined4 in_register_00000034;
  byte *pbVar2;
  Fault f;
  size_t size;
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  byte *local_18;
  
  params_2 = &this->fillPos;
  pbVar2 = this->fillPos;
  size = (size_t)__buf;
  if ((pbVar2 == (byte *)CONCAT44(in_register_00000034,__fd)) &&
     (pbVar1 = (this->array).ptr + (this->array).size_, pbVar2 != pbVar1)) {
    _kjCondition.right = (unsigned_long)(pbVar1 + -(long)pbVar2);
    _kjCondition.left = &size;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.right >= __buf;
    if (_kjCondition.right < __buf) {
      local_18 = (byte *)_kjCondition.right;
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,long>&,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x116,FAILED,"size <= array.end() - fillPos",
                 "_kjCondition,size, fillPos, array.end() - fillPos",
                 (DebugComparison<unsigned_long_&,_long> *)&_kjCondition,_kjCondition.left,params_2,
                 (long *)&local_18);
      _::Debug::Fault::fatal(&f);
    }
    pbVar2 = pbVar2 + (long)__buf;
  }
  else {
    _kjCondition.right = (unsigned_long)((this->array).ptr + ((this->array).size_ - (long)pbVar2));
    _kjCondition.left = &size;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.right >= __buf;
    if (_kjCondition.right < __buf) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,char_const(&)[77]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x11a,FAILED,"size <= (size_t)(array.end() - fillPos)",
                 "_kjCondition,\"ArrayOutputStream\'s backing array was not large enough for the data written.\""
                 ,&_kjCondition,
                 (char (*) [77])
                 "ArrayOutputStream\'s backing array was not large enough for the data written.");
      _::Debug::Fault::fatal(&f);
    }
    _kjCondition.left =
         (unsigned_long *)memcpy(pbVar2,(byte *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
    pbVar2 = *params_2 + size;
  }
  *params_2 = pbVar2;
  return (ssize_t)_kjCondition.left;
}

Assistant:

void ArrayOutputStream::write(ArrayPtr<const byte> src) {
  auto size = src.size();
  if (src.begin() == fillPos && fillPos != array.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= array.end() - fillPos, size, fillPos, array.end() - fillPos);
    fillPos += size;
  } else {
    KJ_REQUIRE(size <= (size_t)(array.end() - fillPos),
            "ArrayOutputStream's backing array was not large enough for the data written.");
    memcpy(fillPos, src.begin(), size);
    fillPos += size;
  }
}